

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O2

int __thiscall CAPSFile::CreateData(CAPSFile *this,IDisk *disk,int side,uint tr,int datakey)

{
  uint uVar1;
  uchar *puVar2;
  MFMTrack *pMVar3;
  undefined8 uVar4;
  EncoderSpsBlockDescriptor EVar5;
  uchar *puVar6;
  pointer paVar7;
  byte bVar8;
  uchar byte;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uchar *puVar15;
  size_t __n;
  int iVar16;
  size_t __n_00;
  int nb_byte_to_add;
  long lVar17;
  int iVar18;
  CAPSFile *this_00;
  uint *puVar19;
  int iVar20;
  iterator it;
  Side *pSVar21;
  ulong uVar22;
  pointer paVar23;
  int nb_byte_to_add_00;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int local_170;
  int local_16c;
  StreamRecording gap_data;
  StreamRecording data;
  value_type local_108;
  vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
  list_block_descriptor;
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined1 local_98 [28];
  undefined1 local_7c [16];
  undefined1 local_6c [16];
  undefined1 local_5c [16];
  uchar local_4c [4];
  uchar pattern_byte [16];
  
  data.offset = 0;
  data.buffer = (uchar *)operator_new__(0x80);
  data.size = 0x80;
  gap_data.offset = 0;
  gap_data.buffer = (uchar *)operator_new__(0x80);
  gap_data.size = 0x80;
  list_block_descriptor.
  super__Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c[0] = '\0';
  local_4c[1] = '\0';
  local_4c[2] = '\0';
  local_4c[3] = '\0';
  list_block_descriptor.
  super__Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  list_block_descriptor.
  super__Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uStack_a8 = 0;
  local_c8 = (undefined1  [16])0x0;
  auVar24 = local_c8;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_b8 = 0;
  uStack_b4 = 0;
  uStack_b0 = 0;
  uStack_ac = 0;
  local_98[0] = 'I';
  local_98[1] = 'M';
  local_98[2] = 'G';
  local_98[3] = 'E';
  local_98._4_4_ = 0x50;
  local_98._8_4_ = 0;
  local_98._20_4_ = 2;
  local_98._24_4_ = 1;
  local_7c = (undefined1  [16])0x0;
  local_6c = (undefined1  [16])0x0;
  local_5c = (undefined1  [16])0x0;
  local_98._12_4_ = tr;
  local_98._16_4_ = side;
  if ((side < (int)(uint)disk->nb_sides_) && (tr < disk->side_[side].nb_tracks)) {
    pMVar3 = disk->side_[side].tracks;
    puVar15 = pMVar3[tr].bitfield;
    if (puVar15 != (uchar *)0x0) {
      local_c8 = auVar24;
      uVar10 = FindNextPattern(puVar15,pMVar3[tr].size,0,"R$R$R$",6);
      pSVar21 = disk->side_ + side;
      if (uVar10 == 0xffffffff) {
        uVar10 = FindNextSector(puVar15,pSVar21->tracks[tr].size,0,8);
        if (uVar10 == 0xffffffff) {
          local_7c._8_4_ = 0;
          goto LAB_00159fb8;
        }
      }
      auVar24 = local_7c;
      local_7c._8_4_ = uVar10;
      local_7c._0_4_ = auVar24._0_4_;
      local_7c._4_4_ = uVar10 >> 3;
      pMVar3 = pSVar21->tracks;
      puVar15 = (uchar *)operator_new__((ulong)pMVar3[tr].size);
      puVar19 = &pMVar3[tr].size;
      memcpy(puVar15,pMVar3[tr].bitfield + uVar10,(ulong)(*puVar19 - uVar10));
      memcpy(puVar15 + (*puVar19 - uVar10),pMVar3[tr].bitfield,(ulong)uVar10);
      iVar16 = 0;
      iVar18 = 0x10;
      for (uVar10 = *puVar19 - 0x11; uVar10 + 1 != 0; uVar10 = uVar10 - 0x10) {
        puVar2 = puVar15 + (uVar10 + 1);
        auVar24[0] = -(*puVar2 == '\x01');
        auVar24[1] = -(puVar2[1] == '\0');
        auVar24[2] = -(puVar2[2] == '\x01');
        auVar24[3] = -(puVar2[3] == '\0');
        auVar24[4] = -(puVar2[4] == '\x01');
        auVar24[5] = -(puVar2[5] == '\0');
        auVar24[6] = -(puVar2[6] == '\x01');
        auVar24[7] = -(puVar2[7] == '\0');
        auVar24[8] = -(puVar2[8] == '\x01');
        auVar24[9] = -(puVar2[9] == '\0');
        auVar24[10] = -(puVar2[10] == '\x01');
        auVar24[0xb] = -(puVar2[0xb] == '\0');
        auVar24[0xc] = -(puVar2[0xc] == '\x01');
        auVar24[0xd] = -(puVar2[0xd] == '\0');
        auVar24[0xe] = -(puVar2[0xe] == '\x01');
        auVar24[0xf] = -(puVar2[0xf] == '\0');
        if (((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar24[0xf] >> 7) << 0xf) != 0xffff) || (puVar15[uVar10] == '\x01'))
        break;
        iVar16 = iVar16 + 1;
        iVar18 = iVar18 + 0x10;
      }
      iVar20 = 0;
      local_16c = 0;
      iVar14 = 0;
      local_170 = 0;
      uVar10 = 0;
      while (uVar10 != 0xffffffff) {
        local_108.block_bits = 0;
        local_108.gap_bits = 0;
        local_108.sps_specific.cell_type = 0;
        local_108.encoder_type = 0;
        local_108.block_flag = 0;
        local_108.gap_value = 0;
        local_108.data_offset = data.offset;
        local_108.sps_specific.gap_offset = gap_data.offset;
        uVar11 = FindNextSector(puVar15,pSVar21->tracks[tr].size,uVar10 + 1,8);
        if (uVar11 == 0xffffffff) {
          uVar22 = (ulong)(pSVar21->tracks[tr].size - iVar18);
          nb_byte_to_add = iVar16;
        }
        else {
          uVar12 = uVar11 - 0x11;
          nb_byte_to_add = 0;
          while( true ) {
            uVar1 = uVar12 + 1;
            uVar22 = (ulong)uVar1;
            if (uVar1 <= uVar10) break;
            puVar2 = puVar15 + uVar1;
            auVar25[0] = -(*puVar2 == DAT_001a9580);
            auVar25[1] = -(puVar2[1] == DAT_001a9580._1_1_);
            auVar25[2] = -(puVar2[2] == DAT_001a9580._2_1_);
            auVar25[3] = -(puVar2[3] == DAT_001a9580._3_1_);
            auVar25[4] = -(puVar2[4] == DAT_001a9580._4_1_);
            auVar25[5] = -(puVar2[5] == DAT_001a9580._5_1_);
            auVar25[6] = -(puVar2[6] == DAT_001a9580._6_1_);
            auVar25[7] = -(puVar2[7] == DAT_001a9580._7_1_);
            auVar25[8] = -(puVar2[8] == DAT_001a9580._8_1_);
            auVar25[9] = -(puVar2[9] == DAT_001a9580._9_1_);
            auVar25[10] = -(puVar2[10] == DAT_001a9580._10_1_);
            auVar25[0xb] = -(puVar2[0xb] == DAT_001a9580._11_1_);
            auVar25[0xc] = -(puVar2[0xc] == DAT_001a9580._12_1_);
            auVar25[0xd] = -(puVar2[0xd] == DAT_001a9580._13_1_);
            auVar25[0xe] = -(puVar2[0xe] == DAT_001a9580._14_1_);
            auVar25[0xf] = -(puVar2[0xf] == DAT_001a9580._15_1_);
            if (((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff) ||
               (puVar15[uVar12] == '\x01')) break;
            nb_byte_to_add = nb_byte_to_add + 1;
            uVar12 = uVar12 - 0x10;
          }
        }
        uVar12 = (uint)uVar22;
        pattern_byte._0_8_ = *(undefined8 *)(puVar15 + (int)uVar12);
        pattern_byte._8_8_ = *(undefined8 *)(puVar15 + (int)uVar12 + 8);
        iVar13 = (*this->_vptr_CAPSFile[10])(this,pattern_byte,0x10);
        nb_byte_to_add_00 = 0;
        if ((char)iVar13 != '\0') {
          nb_byte_to_add_00 = 0;
          while (uVar12 = (uint)uVar22, uVar10 < uVar12) {
            puVar2 = puVar15 + uVar22;
            auVar26[0] = -(*puVar2 == pattern_byte[0]);
            auVar26[1] = -(puVar2[1] == pattern_byte[1]);
            auVar26[2] = -(puVar2[2] == pattern_byte[2]);
            auVar26[3] = -(puVar2[3] == pattern_byte[3]);
            auVar26[4] = -(puVar2[4] == pattern_byte[4]);
            auVar26[5] = -(puVar2[5] == pattern_byte[5]);
            auVar26[6] = -(puVar2[6] == pattern_byte[6]);
            auVar26[7] = -(puVar2[7] == pattern_byte[7]);
            auVar26[8] = -(puVar2[8] == pattern_byte[8]);
            auVar26[9] = -(puVar2[9] == pattern_byte[9]);
            auVar26[10] = -(puVar2[10] == pattern_byte[10]);
            auVar26[0xb] = -(puVar2[0xb] == pattern_byte[0xb]);
            auVar26[0xc] = -(puVar2[0xc] == pattern_byte[0xc]);
            auVar26[0xd] = -(puVar2[0xd] == pattern_byte[0xd]);
            auVar26[0xe] = -(puVar2[0xe] == pattern_byte[0xe]);
            auVar26[0xf] = -(puVar2[0xf] == pattern_byte[0xf]);
            if ((((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar26[0xf] >> 7) << 0xf) != 0xffff) ||
                (((bVar8 = puVar15[uVar12 - 1] & puVar15[uVar22], uVar10 < uVar12 - 1 &&
                  (bVar8 == 1)) || ((puVar15[uVar12 + 1] & bVar8) != 1)))) ||
               ((1 < uVar12 && ((bVar8 & puVar15[uVar12 - 2]) != 1)))) break;
            nb_byte_to_add_00 = nb_byte_to_add_00 + 1;
            uVar22 = (ulong)(uVar12 - 0x10);
          }
        }
        this_00 = (CAPSFile *)pattern_byte;
        byte = IDisk::ConvertMFMToByte((uchar *)this_00);
        AddGapRecord(this_00,&gap_data,nb_byte_to_add_00,byte);
        local_108.gap_bits = local_108.gap_bits + nb_byte_to_add_00 * 0x10;
        if (nb_byte_to_add != 0) {
          AddGapRecord(this_00,&gap_data,nb_byte_to_add,'\0');
          local_108.gap_bits = local_108.gap_bits + nb_byte_to_add * 0x10;
          local_170 = local_170 + nb_byte_to_add * 0x10;
          iVar14 = iVar14 + nb_byte_to_add * 2;
          local_108.block_flag = local_108.block_flag | 2;
        }
        local_170 = local_170 + nb_byte_to_add_00 * 0x10;
        local_6c._0_4_ = local_170;
        iVar14 = iVar14 + nb_byte_to_add_00 * 2;
        local_7c._0_4_ = iVar14;
        if (nb_byte_to_add_00 != 0) {
          local_108.block_flag = local_108.block_flag | 1;
        }
        bVar9 = AddStreamRecord(this_00,&data,puVar15,uVar10,uVar12 + 0x10,pSVar21->tracks[tr].size)
        ;
        local_108.block_bits = (uVar12 + 0x10) - uVar10;
        local_16c = local_16c + local_108.block_bits;
        local_7c._12_4_ = local_16c;
        iVar14 = iVar14 + (local_108.block_bits + 7 >> 3);
        local_7c._0_4_ = iVar14;
        local_108.sps_specific.cell_type = 1;
        local_108.encoder_type = 1;
        if (!bVar9) {
          local_108.block_flag = local_108.block_flag | 4;
        }
        local_108.gap_value = 0x4e;
        std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>::
        push_back(&list_block_descriptor,&local_108);
        iVar20 = iVar20 + 1;
        local_6c._8_4_ = iVar20;
        uVar10 = uVar11;
      }
      operator_delete__(puVar15);
      __n_00 = (size_t)gap_data.offset;
      __n = (size_t)data.offset;
      goto LAB_00159fd7;
    }
  }
LAB_00159fb8:
  local_98._20_4_ = 1;
  local_16c = 0;
  local_170 = 0;
  __n = 0;
  __n_00 = 0;
LAB_00159fd7:
  local_c8._0_8_ = 0x1c41544144;
  paVar23 = list_block_descriptor.
            super__Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar7 = list_block_descriptor.
           super__Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar11 = (int)list_block_descriptor.
                super__Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_finish -
           (int)list_block_descriptor.
                super__Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_start & 0xffffffe0;
  iVar18 = uVar11 + (int)__n_00;
  uVar10 = (int)__n + iVar18;
  local_c8._12_4_ = uVar10;
  local_b8 = uVar10 * 8;
  puVar15 = (uchar *)operator_new__((ulong)uVar10);
  uStack_ac = SUB84(puVar15,0);
  uStack_a8 = (undefined4)((ulong)puVar15 >> 0x20);
  lVar17 = 0;
  for (; puVar2 = gap_data.buffer, paVar23 != paVar7; paVar23 = paVar23 + 1) {
    (paVar23->sps_specific).gap_offset = (paVar23->sps_specific).gap_offset + uVar11;
    paVar23->data_offset = paVar23->data_offset + iVar18;
    lVar17 = (long)(int)lVar17;
    uVar4 = *(undefined8 *)&paVar23->gap_value;
    *(undefined8 *)(puVar15 + lVar17 + 0x10) = *(undefined8 *)&paVar23->encoder_type;
    *(undefined8 *)(puVar15 + lVar17 + 0x10 + 8) = uVar4;
    EVar5 = paVar23->sps_specific;
    *(undefined8 *)(puVar15 + lVar17) = *(undefined8 *)paVar23;
    *(EncoderSpsBlockDescriptor *)(puVar15 + lVar17 + 8) = EVar5;
    Swap(puVar15 + lVar17,0x20);
    lVar17 = lVar17 + 0x20;
  }
  memcpy(puVar15 + (int)uVar11,gap_data.buffer,__n_00);
  puVar6 = data.buffer;
  memcpy(puVar15 + iVar18,data.buffer,__n);
  local_5c._4_4_ = datakey;
  uStack_b0 = datakey;
  uStack_b4 = CRC::ComputeCrc32(0xedb88320,puVar15,uVar10);
  local_6c._4_4_ = local_16c + local_170;
  uVar10 = CRC::ComputeCrc32(0xedb88320,local_98,0x50);
  local_98._8_4_ =
       uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>::push_back
            (&this->list_imge_,(value_type *)local_98);
  std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>::push_back
            (&this->list_data_,(value_type *)local_c8);
  if (puVar6 != (uchar *)0x0) {
    operator_delete__(puVar6);
  }
  if (puVar2 != (uchar *)0x0) {
    operator_delete__(puVar2);
  }
  std::_Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>::
  ~_Vector_base(&list_block_descriptor.
                 super__Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
               );
  return 0;
}

Assistant:

int CAPSFile::CreateData(IDisk* disk, int side, unsigned int tr, int datakey)
{
   // Create IMGE and data structure
   ImgeItem imge_item;
   DataChunks data_chunk;

   bool abort = false;

   StreamRecording gap_data;
   StreamRecording data;
   data.offset = 0;
   data.buffer = new unsigned char[128];
   data.size = 128;

   gap_data.offset = 0;
   gap_data.buffer = new unsigned char[128];
   gap_data.size = 128;

   int gap_offset = 0;
   //unsigned char* pData = new unsigned char[128];
   int max_size_data = 128;

   // Block descriptor vector
   std::vector<BlockDescriptor> list_block_descriptor;


   memset(&imge_item, 0, sizeof(imge_item));
   memset(&data_chunk, 0, sizeof(data_chunk));

   // &disk->m_Disk[side].Tracks[tr]);

   ////////////
   // IMGE
   memcpy(imge_item.header.type, "IMGE", 4);
   imge_item.header.crc = 0;
   imge_item.header.length = 0x50;
   imge_item.track_number = tr;
   imge_item.side = side;
   imge_item.density = 2; // auto
   imge_item.signal_type = 1; // 2us cell
   imge_item.track_byte = 0; //
   imge_item.start_byte_pos = 0;
   imge_item.start_bit_pos = 0;
   imge_item.data_bits = 0;
   imge_item.gap_bits = 0;
   imge_item.track_bits = 0;
   imge_item.block_count = 0;
   imge_item.encoder_process = 0; // 0
   imge_item.track_flags = 0;
   imge_item.data_key = 0;

   // Nothing on this side / track ?
   if (side >= disk->nb_sides_ || tr >= disk->side_[side].nb_tracks)
   {
      imge_item.start_bit_pos = 0;
      imge_item.density = 1;
      abort = true;
      //goto End;//return 0;
   }

   unsigned char* track_field = nullptr;
   if (!abort)
   {
      track_field = disk->side_[side].tracks[tr].bitfield;
      // DATA
      if (track_field == NULL)
      {
         imge_item.start_bit_pos = 0;
         imge_item.density = 1;
         abort = true;
         //goto End;//return 0;
      }
   }

   unsigned int startbitpos = 0;
   // Construct DATA associated :
   // Find begining of track

   // Find the 0x5224 0x5224 0x5224  first sync
   unsigned int search_offset = 0;
   unsigned int current_recored_offset = 0;

   unsigned char pattern_byte[16];

   if (!abort)
   {
      // Only search the 3 x 0x5224 bytes
      search_offset = FindNextPattern(track_field, disk->side_[side].tracks[tr].size, search_offset, pPatternC2, 6);
      if (search_offset != -1)
      {
         imge_item.start_bit_pos = (search_offset != -1) ? search_offset : 0;
         imge_item.start_byte_pos = imge_item.start_bit_pos / 8;
      }
      else
      {
         search_offset = FindNextSector(track_field, disk->side_[side].tracks[tr].size, search_offset + 1, 8);
         if (search_offset != -1)
         {
            imge_item.start_bit_pos = (search_offset != -1) ? search_offset : 0;
            imge_item.start_byte_pos = imge_item.start_bit_pos / 8;
         }
         else
         {
            // Not a formatted disk : Generate random data
            imge_item.start_bit_pos = 0;
            imge_item.density = 1;
            int dbg = 1;
            //goto End;
            abort = true;
         }
      }
   }

   if (!abort)
   {
      track_field = new unsigned char[disk->side_[side].tracks[tr].size];
      memcpy(track_field, &disk->side_[side].tracks[tr].bitfield[imge_item.start_bit_pos],
             disk->side_[side].tracks[tr].size - imge_item.start_bit_pos);
      memcpy(&track_field[disk->side_[side].tracks[tr].size - imge_item.start_bit_pos],
             disk->side_[side].tracks[tr].bitfield, imge_item.start_bit_pos);

      search_offset = 0;
      int initial_backward_gap = 0;
      unsigned int offset_gap = disk->side_[side].tracks[tr].size - 16;
      while ((offset_gap > current_recored_offset && memcmp(&track_field[offset_gap], pPattern00, 16) == 0)
         && (offset_gap < 1 || track_field[offset_gap - 1] != 1)
      )
      {
         offset_gap -= 16;
         initial_backward_gap++;
      }

      while (search_offset != -1)
      {
         int nb_backward_gap_bytes = 0;
         // Add it : Descriptor, and data
         BlockDescriptor block_descriptor;
         memset(&block_descriptor, 0, sizeof(block_descriptor));

         block_descriptor.block_flag = 0;
         block_descriptor.data_offset = data.offset;
         block_descriptor.sps_specific.gap_offset = gap_data.offset;


         unsigned int search_next_offset = FindNextSector(track_field, disk->side_[side].tracks[tr].size,
                                                          search_offset + 1, 8);
         int end_of_block = 0;
         if (search_next_offset != -1)
         {
            // Next block found : Dont use the '0x00' sync bytes before it - It's the 'backward' gap
            unsigned int offset_gap = search_next_offset - 16;
            nb_backward_gap_bytes = 0;
            while ((offset_gap > search_offset && memcmp(&track_field[offset_gap], pPattern00, 16) == 0)
               && (offset_gap < 1 || track_field[offset_gap - 1] != 1)
            )
            {
               offset_gap -= 16;
               nb_backward_gap_bytes++;
            }
            end_of_block = offset_gap + 16;
         }
         else
         {
            // End block : until the end, then until IMGEitem.start_bit_pos
            nb_backward_gap_bytes = initial_backward_gap;
            end_of_block = disk->side_[side].tracks[tr].size - nb_backward_gap_bytes * 16;
         }

         // What to record : From the next block, until it changed, record the "forward gap"
         memcpy(pattern_byte, &track_field[end_of_block - 16], 16);
         int nb_gap_bytes = 0;
         unsigned int offset_gap = end_of_block - 16;

         // Only if no weak bits in the pattern !
         if (NoWeakBitInPattern(pattern_byte, 16))
         {
            if (pattern_byte[0] == 0
               && pattern_byte[15] == 0
               && (pattern_byte[14] & pattern_byte[1]) == 0
            )
            {
               int dbg = 1;
            }

            while ((offset_gap > search_offset && memcmp(&track_field[offset_gap], pattern_byte, 16) == 0)
               && (((track_field[offset_gap] & track_field[offset_gap - 1]) != 1) || offset_gap - 1 <= search_offset)
               && (offset_gap < 1 || ((track_field[offset_gap - 1] & track_field[offset_gap] & track_field[offset_gap +
                     1]) == 1)
                  && (offset_gap < 2 || (track_field[offset_gap - 1] & track_field[offset_gap] & track_field[offset_gap
                     - 2]) == 1)
               )
            )
            {
               offset_gap -= 16;
               nb_gap_bytes++;
            }
         }
         offset_gap += 16;
         // pPatternByte -> signel byte
         unsigned char byte = IDisk::ConvertMFMToByte(pattern_byte);
         {
            AddGapRecord(&gap_data, nb_gap_bytes, byte);
            block_descriptor.gap_bits += nb_gap_bytes * 16;
            if (nb_backward_gap_bytes > 0)
            {
               AddGapRecord(&gap_data, nb_backward_gap_bytes, 0x00);
               block_descriptor.gap_bits += nb_backward_gap_bytes * 16;
               imge_item.gap_bits += 16 * nb_backward_gap_bytes;
               imge_item.track_byte += nb_backward_gap_bytes * 2;
               block_descriptor.block_flag |= 2;
            }


            imge_item.gap_bits += 16 * nb_gap_bytes;
            imge_item.track_byte += nb_gap_bytes * 2;
            if (nb_gap_bytes > 0)
               block_descriptor.block_flag |= 1;

            // TODO : Adjust at bit value
            // data itself : Add the data (supposed to pPatternC2 + 16 bits (FC most of the time)
            // From searchOffset -> offsetGap;
            bool byte_size = AddStreamRecord(&data, track_field, search_offset, offset_gap,
                                             disk->side_[side].tracks[tr].size);
            imge_item.data_bits += (offset_gap - search_offset);
            imge_item.track_byte += (offset_gap - search_offset + 7) / 8;

            // Block descriptor : End the description
            block_descriptor.block_bits = (offset_gap - search_offset);
            block_descriptor.sps_specific.cell_type = 1;
            block_descriptor.encoder_type = 1;

            if (!byte_size)
               block_descriptor.block_flag |= 4; // in byte. TODO : Use value for bits
            block_descriptor.gap_value = 0x4E;

            list_block_descriptor.push_back(block_descriptor);
            imge_item.block_count++;

            search_offset = search_next_offset;
         }

         // Next blocks
      }

      delete[]track_field;
   }
   // End of track (or unformatted ones !)
   // TODO
   //End:

   // End : Now compile every descriptor, then every datas ( ).
   // dataoffset and gapoffsets
   memcpy(data_chunk.header.type, "DATA", 4);
   data_chunk.header.length = sizeof (data_chunk) - sizeof (unsigned char*); //+ listBlockDescriptor.size() * sizeof(tBlockDescriptor);
   //dataChunk.header.Length += data.Offset + gapData.Offset;
   data_chunk.size = list_block_descriptor.size() * sizeof(BlockDescriptor);
   int final_gap_offset = data_chunk.size;
   int final_data_offset = final_gap_offset + gap_data.offset;

   data_chunk.size += gap_data.offset;
   data_chunk.size += data.offset;
   data_chunk.bit_size = data_chunk.size * 8;

   // Now compile DATA chunks into a buffer
   data_chunk.buffer = new unsigned char[data_chunk.size];
   int final_offset = 0;

   for (std::vector<BlockDescriptor>::iterator it = list_block_descriptor.begin(); it != list_block_descriptor.end(); it
        ++)
   {
      // Adjust gap offset
      it->sps_specific.gap_offset += final_gap_offset;
      // Adjust data offset
      it->data_offset += final_data_offset;

      // Copy block descriptor
      memcpy(&data_chunk.buffer[final_offset], &(*it), sizeof(BlockDescriptor));
      Swap(&data_chunk.buffer[final_offset], sizeof(BlockDescriptor));
      final_offset += sizeof(BlockDescriptor);
   }
   memcpy(&data_chunk.buffer[final_gap_offset], gap_data.buffer, gap_data.offset);
   memcpy(&data_chunk.buffer[final_data_offset], data.buffer, data.offset);

   data_chunk.data_id = imge_item.data_key = datakey;
   data_chunk.data_crc = CRC::ComputeCrc32(0xEDB88320, data_chunk.buffer, data_chunk.size);

   // Now, update IMGE
   imge_item.track_bits = imge_item.gap_bits + imge_item.data_bits;

   if (side < disk->nb_sides_ && tr < disk->side_[side].nb_tracks)
   {
      if (disk->side_[side].tracks[tr].size != imge_item.track_bits)
      {
         // error ?
         int dbg = 1;
      }
   }
   // .. To add

   // CRC
   imge_item.header.crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, (unsigned char*)&imge_item, sizeof(imge_item)));

   list_imge_.push_back(imge_item);
   list_data_.push_back(data_chunk);

   delete []data.buffer;
   delete []gap_data.buffer;

   return 0;
}